

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O3

XXH64_hash_t XXH64_digest(XXH64_state_t *state_in)

{
  unsigned_long_long uVar1;
  ulong uVar2;
  ulong uVar3;
  unsigned_long_long *puVar4;
  unsigned_long_long *puVar5;
  long lVar6;
  ulong uVar7;
  uint *puVar8;
  unsigned_long_long *puVar9;
  
  if (state_in->total_len < 0x20) {
    lVar6 = state_in->v3 + 0x27d4eb2f165667c5;
  }
  else {
    uVar1 = state_in->v1;
    uVar7 = state_in->v2;
    uVar2 = state_in->v3;
    uVar3 = state_in->v4;
    lVar6 = ((uVar3 * -0x6c158a5880000000 | uVar3 * -0x3d4d51c2d82b14b1 >> 0x21) *
             -0x61c8864e7a143579 ^
            ((uVar2 * -0x6c158a5880000000 | uVar2 * -0x3d4d51c2d82b14b1 >> 0x21) *
             -0x61c8864e7a143579 ^
            ((uVar7 * -0x6c158a5880000000 | uVar7 * -0x3d4d51c2d82b14b1 >> 0x21) *
             -0x61c8864e7a143579 ^
            ((uVar1 * -0x6c158a5880000000 | uVar1 * -0x3d4d51c2d82b14b1 >> 0x21) *
             -0x61c8864e7a143579 ^
            (uVar3 << 0x12 | uVar3 >> 0x2e) + (uVar2 << 0xc | uVar2 >> 0x34) +
            (uVar7 << 7 | uVar7 >> 0x39) + (uVar1 << 1 | (ulong)((long)uVar1 < 0))) *
            -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) *
            -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + -0x7a1435883d4d519d;
  }
  puVar8 = (uint *)((long)state_in->mem64 + (ulong)state_in->memsize);
  puVar9 = state_in->mem64;
  uVar7 = lVar6 + state_in->total_len;
  puVar4 = puVar9;
  if (7 < state_in->memsize) {
    do {
      uVar7 = (*puVar4 * -0x6c158a5880000000 | *puVar4 * -0x3d4d51c2d82b14b1 >> 0x21) *
              -0x61c8864e7a143579 ^ uVar7;
      uVar7 = (uVar7 << 0x1b | uVar7 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
      puVar9 = puVar4 + 1;
      puVar5 = puVar4 + 2;
      puVar4 = puVar9;
    } while (puVar5 <= puVar8);
  }
  if ((unsigned_long_long *)((long)puVar9 + 4U) <= puVar8) {
    uVar7 = (ulong)(uint)*puVar9 * -0x61c8864e7a143579 ^ uVar7;
    uVar7 = (uVar7 << 0x17 | uVar7 >> 0x29) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9;
    puVar9 = (unsigned_long_long *)((long)puVar9 + 4U);
  }
  for (; puVar9 < puVar8; puVar9 = (unsigned_long_long *)((long)puVar9 + 1)) {
    uVar7 = (ulong)(byte)*puVar9 * 0x27d4eb2f165667c5 ^ uVar7;
    uVar7 = (uVar7 << 0xb | uVar7 >> 0x35) * -0x61c8864e7a143579;
  }
  uVar7 = (uVar7 >> 0x21 ^ uVar7) * -0x3d4d51c2d82b14b1;
  uVar7 = (uVar7 >> 0x1d ^ uVar7) * 0x165667b19e3779f9;
  return uVar7 >> 0x20 ^ uVar7;
}

Assistant:

XXH_PUBLIC_API unsigned long long XXH64_digest (const XXH64_state_t* state_in)
{
    XXH_endianess endian_detected = (XXH_endianess)XXH_CPU_LITTLE_ENDIAN;

    if ((endian_detected==XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
        return XXH64_digest_endian(state_in, XXH_littleEndian);
    else
        return XXH64_digest_endian(state_in, XXH_bigEndian);
}